

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.hpp
# Opt level: O0

void __thiscall procxx::pipe_t::pipe_end::pipe_end(pipe_end *this,uint end)

{
  exception *this_00;
  uint end_local;
  pipe_end *this_local;
  
  if ((end != 0) && (end != 1)) {
    this_00 = (exception *)__cxa_allocate_exception(0x10);
    exception::runtime_error(this_00,"invalid pipe end");
    __cxa_throw(this_00,&exception::typeinfo,exception::~exception);
  }
  this->end_ = end;
  return;
}

Assistant:

pipe_end(unsigned int end) {
      if (end != READ_END && end != WRITE_END)
        throw exception{"invalid pipe end"};
      end_ = end;
    }